

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

QRenderRule * __thiscall
QStyleSheetStyle::renderRule
          (QRenderRule *__return_storage_ptr__,QStyleSheetStyle *this,QObject *obj,int element,
          quint64 state)

{
  Span *pSVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 *puVar8;
  storage_type *psVar9;
  QStyleSheetStyle *this_00;
  long lVar10;
  QStyleSheetStyle *this_01;
  long in_FS_OFFSET;
  const_iterator cVar11;
  QStringView QVar12;
  QStringView QVar13;
  QByteArrayView QVar14;
  QLatin1String QVar15;
  QLatin1String QVar16;
  quint64 negated;
  ulong local_d0;
  QArrayDataPointer<QCss::Declaration> local_c8;
  QString local_a8;
  QArrayDataPointer<QCss::StyleRule> local_88;
  quint64 local_70;
  int local_64;
  QObject *local_60;
  TryEmplaceResult local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_70 = state;
  local_64 = element;
  local_60 = obj;
  if (obj != (QObject *)0x0) {
    (*(code *)**(undefined8 **)obj)(obj);
    pcVar5 = (char *)QMetaObject::className();
    iVar4 = qstrcmp(pcVar5,"QDockWidgetTitleButton");
    if (iVar4 == 0) {
      QObject::objectName();
      if (local_58._16_8_ == 0x19) {
        QVar12.m_data = (storage_type_conflict *)local_58.iterator.i.bucket;
        QVar12.m_size = 0x19;
        QVar15.m_data = "qt_dockwidget_closebutton";
        QVar15.m_size = 0x19;
        cVar2 = QtPrivate::equalStrings(QVar12,QVar15);
      }
      else {
        cVar2 = '\0';
      }
      if (local_58.iterator.i.d != (Data<QHashPrivate::Node<unsigned_long_long,_QRenderRule>_> *)0x0
         ) {
        LOCK();
        ((local_58.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
             ((local_58.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_58.iterator.i.d,2,0x10);
        }
      }
      if (cVar2 == '\0') {
        QObject::objectName();
        if (local_58._16_8_ == 0x19) {
          QVar13.m_data = (storage_type_conflict *)local_58.iterator.i.bucket;
          QVar13.m_size = 0x19;
          QVar16.m_data = "qt_dockwidget_floatbutton";
          QVar16.m_size = 0x19;
          cVar2 = QtPrivate::equalStrings(QVar13,QVar16);
        }
        else {
          cVar2 = '\0';
        }
        if (local_58.iterator.i.d !=
            (Data<QHashPrivate::Node<unsigned_long_long,_QRenderRule>_> *)0x0) {
          LOCK();
          ((local_58.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
               ((local_58.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_58.iterator.i.d,2,0x10);
          }
        }
        if (cVar2 != '\0') {
          local_64 = 0x3c;
        }
      }
      else {
        local_64 = 0x3b;
      }
      local_60 = *(QObject **)(*(long *)(local_60 + 8) + 0x10);
    }
  }
  QHash<QObject_const*,QHash<int,QHash<unsigned_long_long,QRenderRule>>>::
  tryEmplace_impl<QObject_const*const&>
            ((TryEmplaceResult *)&local_58,
             (QHash<QObject_const*,QHash<int,QHash<unsigned_long_long,QRenderRule>>> *)
             &styleSheetCaches->renderRulesCache,&local_60);
  QHash<int,QHash<unsigned_long_long,QRenderRule>>::tryEmplace_impl<int_const&>
            ((TryEmplaceResult *)&local_58,
             (((local_58.iterator.i.d)->spans[local_58.iterator.i.bucket >> 7].entries)->storage).
             data + (ulong)(local_58.iterator.i.d)->spans[local_58.iterator.i.bucket >> 7].offsets
                           [(uint)local_58.iterator.i.bucket & 0x7f] * 0x10 + 8,&local_64);
  this_01 = (QStyleSheetStyle *)
            ((((local_58.iterator.i.d)->spans[local_58.iterator.i.bucket >> 7].entries)->storage).
             data + (ulong)(local_58.iterator.i.d)->spans[local_58.iterator.i.bucket >> 7].offsets
                           [(uint)local_58.iterator.i.bucket & 0x7f] * 0x10 + 8);
  this_00 = this_01;
  cVar11 = QHash<unsigned_long_long,_QRenderRule>::constFindImpl<unsigned_long_long>
                     ((QHash<unsigned_long_long,_QRenderRule> *)this_01,&local_70);
  if (cVar11.i.d == (Data<QHashPrivate::Node<unsigned_long_long,_QRenderRule>_> *)0x0 &&
      cVar11.i.bucket == 0) {
    bVar3 = initObject(this_00,local_60);
    if (bVar3) {
      local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.ptr = (StyleRule *)&DAT_aaaaaaaaaaaaaaaa;
      styleRules((QList<QCss::StyleRule> *)&local_88,this,local_60);
      if ((undefined1 *)local_88.size == (undefined1 *)0x0) {
        uVar7 = 0;
      }
      else {
        lVar10 = 8;
        puVar8 = (undefined1 *)0x0;
        uVar7 = 0;
        do {
          local_58.iterator.i.d = (Data<QHashPrivate::Node<unsigned_long_long,_QRenderRule>_> *)0x0;
          uVar6 = QCss::Selector::pseudoClass
                            (*(ulonglong **)((long)&((local_88.ptr)->selectors).d.d + lVar10));
          uVar7 = uVar6 | uVar7 | (ulong)local_58.iterator.i.d;
          puVar8 = puVar8 + 1;
          lVar10 = lVar10 + 0x38;
        } while (puVar8 < (ulong)local_88.size);
      }
      local_58.iterator.i.d =
           (Data<QHashPrivate::Node<unsigned_long_long,_QRenderRule>_> *)(local_70 & uVar7);
      cVar11 = QHash<unsigned_long_long,_QRenderRule>::constFindImpl<unsigned_long_long>
                         ((QHash<unsigned_long_long,_QRenderRule> *)this_01,
                          (unsigned_long_long *)&local_58);
      if (cVar11.i.d == (Data<QHashPrivate::Node<unsigned_long_long,_QRenderRule>_> *)0x0 &&
          cVar11.i.bucket == 0) {
        local_a8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_a8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_a8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        psVar9 = (storage_type *)0xffffffffffffffff;
        do {
          pcVar5 = psVar9 + (long)local_64 * 0x18 + 0x67ede5;
          psVar9 = psVar9 + 1;
        } while (*pcVar5 != '\0');
        QVar14.m_data = psVar9;
        QVar14.m_size = (qsizetype)&local_58;
        QString::fromLatin1(QVar14);
        local_a8.d.d = (Data *)local_58.iterator.i.d;
        local_a8.d.ptr = (char16_t *)local_58.iterator.i.bucket;
        local_a8.d.size = local_58._16_8_;
        local_c8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_c8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_c8.ptr = (Declaration *)&DAT_aaaaaaaaaaaaaaaa;
        declarations((QList<QCss::Declaration> *)&local_c8,(QList<QCss::StyleRule> *)&local_88,
                     &local_a8,local_70);
        memset(__return_storage_ptr__,0xaa,0x88);
        QRenderRule::QRenderRule
                  (__return_storage_ptr__,(QList<QCss::Declaration> *)&local_c8,local_60);
        QHash<unsigned_long_long,QRenderRule>::tryEmplace_impl<unsigned_long_long_const&>
                  (&local_58,this_01,&local_70);
        QRenderRule::operator=
                  ((QRenderRule *)
                   ((((local_58.iterator.i.d)->spans[local_58.iterator.i.bucket >> 7].entries)->
                    storage).data +
                   (ulong)((uint)(local_58.iterator.i.d)->spans[local_58.iterator.i.bucket >> 7].
                                 offsets[(uint)local_58.iterator.i.bucket & 0x7f] * 0x90) + 8),
                   __return_storage_ptr__);
        if ((uVar7 & local_70) != local_70) {
          local_d0 = uVar7 & local_70;
          QHash<unsigned_long_long,QRenderRule>::tryEmplace_impl<unsigned_long_long_const&>
                    (&local_58,this_01,&local_d0);
          QRenderRule::operator=
                    ((QRenderRule *)
                     ((((local_58.iterator.i.d)->spans[local_58.iterator.i.bucket >> 7].entries)->
                      storage).data +
                     (ulong)((uint)(local_58.iterator.i.d)->spans[local_58.iterator.i.bucket >> 7].
                                   offsets[(uint)local_58.iterator.i.bucket & 0x7f] * 0x90) + 8),
                     __return_storage_ptr__);
        }
        QArrayDataPointer<QCss::Declaration>::~QArrayDataPointer(&local_c8);
        if ((Data<QHashPrivate::Node<unsigned_long_long,_QRenderRule>_> *)local_a8.d.d !=
            (Data<QHashPrivate::Node<unsigned_long_long,_QRenderRule>_> *)0x0) {
          LOCK();
          ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      else {
        memset(__return_storage_ptr__,0xaa,0x88);
        pSVar1 = (cVar11.i.d)->spans;
        uVar7 = cVar11.i.bucket >> 7;
        QRenderRule::QRenderRule
                  (__return_storage_ptr__,
                   (QRenderRule *)
                   (((pSVar1[uVar7].entries)->storage).data +
                   (ulong)((uint)pSVar1[uVar7].offsets[(uint)cVar11.i.bucket & 0x7f] * 0x90) + 8));
        QHash<unsigned_long_long,QRenderRule>::tryEmplace_impl<unsigned_long_long_const&>
                  (&local_58,this_01,&local_70);
        QRenderRule::operator=
                  ((QRenderRule *)
                   ((((local_58.iterator.i.d)->spans[local_58.iterator.i.bucket >> 7].entries)->
                    storage).data +
                   (ulong)((uint)(local_58.iterator.i.d)->spans[local_58.iterator.i.bucket >> 7].
                                 offsets[(uint)local_58.iterator.i.bucket & 0x7f] * 0x90) + 8),
                   __return_storage_ptr__);
      }
      QArrayDataPointer<QCss::StyleRule>::~QArrayDataPointer(&local_88);
    }
    else {
      QRenderRule::QRenderRule(__return_storage_ptr__);
    }
  }
  else {
    pSVar1 = (cVar11.i.d)->spans;
    uVar7 = cVar11.i.bucket >> 7;
    QRenderRule::QRenderRule
              (__return_storage_ptr__,
               (QRenderRule *)
               (((pSVar1[uVar7].entries)->storage).data +
               (ulong)((uint)pSVar1[uVar7].offsets[(uint)cVar11.i.bucket & 0x7f] * 0x90) + 8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QRenderRule QStyleSheetStyle::renderRule(const QObject *obj, int element, quint64 state) const
{
    qt_check_if_internal_object(&obj, &element);
    QHash<quint64, QRenderRule> &cache = styleSheetCaches->renderRulesCache[obj][element];
    QHash<quint64, QRenderRule>::const_iterator cacheIt = cache.constFind(state);
    if (cacheIt != cache.constEnd())
        return cacheIt.value();

    if (!initObject(obj))
        return QRenderRule();

    quint64 stateMask = 0;
    const QList<StyleRule> rules = styleRules(obj);
    for (int i = 0; i < rules.size(); i++) {
        const Selector& selector = rules.at(i).selectors.at(0);
        quint64 negated = 0;
        stateMask |= selector.pseudoClass(&negated);
        stateMask |= negated;
    }

    cacheIt = cache.constFind(state & stateMask);
    if (cacheIt != cache.constEnd()) {
        QRenderRule newRule = cacheIt.value();
        cache[state] = newRule;
        return newRule;
    }


    const QString part = QLatin1StringView(knownPseudoElements[element].name);
    QList<Declaration> decls = declarations(rules, part, state);
    QRenderRule newRule(decls, obj);
    cache[state] = newRule;
    if ((state & stateMask) != state)
        cache[state&stateMask] = newRule;
    return newRule;
}